

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapic.cc
# Opt level: O0

client * __thiscall rapic::client::operator=(client *this,client *rhs)

{
  memory_order mVar1;
  string *__i;
  string *in_RSI;
  client *in_RDI;
  memory_order __b_1;
  memory_order __b;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  undefined4 uVar2;
  
  std::__cxx11::string::operator=((string *)in_RDI,in_RSI);
  std::__cxx11::string::operator=((string *)&in_RDI->service_,in_RSI + 0x20);
  in_RDI->keepalive_period_ = *(time_t *)(in_RSI + 0x40);
  in_RDI->inactivity_timeout_ = *(time_t *)(in_RSI + 0x48);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
              in_stack_ffffffffffffff98);
  in_RDI->socket_ = *(int *)(in_RSI + 0x68);
  in_RDI->state_ = *(connection_state *)(in_RSI + 0x6c);
  in_RDI->last_keepalive_ = *(time_t *)(in_RSI + 0x70);
  in_RDI->last_activity_ = *(time_t *)(in_RSI + 0x78);
  std::__cxx11::string::operator=((string *)&in_RDI->wbuffer_,in_RSI + 0x80);
  std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::operator=
            ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
             CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),in_stack_ffffffffffffff88
            );
  in_RDI->capacity_ = *(size_t *)(in_RSI + 0xa8);
  std::operator&(memory_order_seq_cst,__memory_order_mask);
  uVar2 = 5;
  std::__atomic_base<unsigned_long>::operator=
            ((__atomic_base<unsigned_long> *)CONCAT44(5,in_stack_ffffffffffffffa0),
             (__int_type)in_stack_ffffffffffffff98);
  __i = in_RSI + 0xb8;
  mVar1 = std::operator&(memory_order_seq_cst,__memory_order_mask);
  std::__atomic_base<unsigned_long>::operator=
            ((__atomic_base<unsigned_long> *)CONCAT44(uVar2,mVar1),(__int_type)__i);
  in_RDI->cur_type_ = *(message_type *)(in_RSI + 0xc0);
  in_RDI->cur_size_ = *(size_t *)(in_RSI + 200);
  *(undefined4 *)(in_RSI + 0x68) = 0xffffffff;
  return in_RDI;
}

Assistant:

auto client::operator=(client&& rhs) noexcept -> client&
{
  address_ = std::move(rhs.address_);
  service_ = std::move(rhs.service_);
  keepalive_period_ = std::move(rhs.keepalive_period_);
  inactivity_timeout_ = std::move(rhs.inactivity_timeout_);
  filters_ = std::move(rhs.filters_);
  socket_ = rhs.socket_;
  state_ = rhs.state_;
  last_keepalive_ = rhs.last_keepalive_;
  last_activity_ = rhs.last_activity_;
  wbuffer_ = std::move(rhs.wbuffer_);
  buffer_ = std::move(rhs.buffer_);
  capacity_ = rhs.capacity_;
  wcount_ = rhs.wcount_.load();
  rcount_ = rhs.rcount_.load();
  cur_type_ = std::move(rhs.cur_type_);
  cur_size_ = std::move(rhs.cur_size_);

  rhs.socket_ = -1;

  return *this;
}